

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O3

cl_mem xmrig::OclLib::createSubBuffer
                 (cl_mem buffer,cl_mem_flags flags,size_t offset,size_t size,cl_int *errcode_ret)

{
  cl_mem p_Var1;
  char *pcVar2;
  char *pcVar3;
  cl_buffer_region region;
  size_t local_38;
  size_t local_30;
  
  local_38 = offset;
  local_30 = size;
  p_Var1 = (*pCreateSubBuffer)(buffer,flags,0x1220,&local_38,errcode_ret);
  if (*errcode_ret != 0) {
    pcVar2 = ocl_tag();
    pcVar3 = OclError::toString(*errcode_ret);
    p_Var1 = (cl_mem)0x0;
    Log::print(ERR,
               "%s\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m with offset \x1b[0m\x1b[1;31m%zu\x1b[0m\x1b[0;31m and size \x1b[0m\x1b[1;31m%zu\x1b[0m"
               ,pcVar2,pcVar3,"clCreateSubBuffer",offset,size);
  }
  return p_Var1;
}

Assistant:

cl_mem xmrig::OclLib::createSubBuffer(cl_mem buffer, cl_mem_flags flags, size_t offset, size_t size, cl_int *errcode_ret) noexcept
{
    const cl_buffer_region region = { offset, size };

    auto result = pCreateSubBuffer(buffer, flags, CL_BUFFER_CREATE_TYPE_REGION, &region, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR("%s" RED(" error ") RED_BOLD("%s") RED(" when calling ") RED_BOLD("%s") RED(" with offset ") RED_BOLD("%zu") RED(" and size ") RED_BOLD("%zu"),
                ocl_tag(), OclError::toString(*errcode_ret), kCreateSubBuffer, offset, size);

        return nullptr;
    }

    return result;
}